

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O0

char * cmd_launch(skynet_context *context,char *param)

{
  uint32_t id;
  long lVar1;
  skynet_context *name;
  size_t __src;
  char *pcVar2;
  undefined8 uStack_70;
  char acStack_68 [8];
  char *local_60;
  skynet_context *local_50;
  skynet_context *inst;
  char *mod;
  char *args;
  unsigned_long __vla_expr0;
  size_t local_28;
  size_t sz;
  char *param_local;
  skynet_context *context_local;
  
  uStack_70 = 0x118f69;
  sz = (size_t)param;
  param_local = (char *)context;
  local_28 = strlen(param);
  __src = sz;
  args = (char *)(local_28 + 1);
  lVar1 = -(local_28 + 0x10 & 0xfffffffffffffff0);
  local_60 = acStack_68 + lVar1;
  __vla_expr0 = (unsigned_long)acStack_68;
  *(undefined8 *)((long)&uStack_70 + lVar1) = 0x118fa0;
  strcpy(acStack_68 + lVar1,(char *)__src);
  mod = local_60;
  *(undefined8 *)((long)&uStack_70 + lVar1) = 0x118fb8;
  inst = (skynet_context *)strsep(&mod," \t\r\n");
  *(undefined8 *)((long)&uStack_70 + lVar1) = 0x118fcc;
  pcVar2 = strsep(&mod,"\r\n");
  name = inst;
  mod = pcVar2;
  *(undefined8 *)((long)&uStack_70 + lVar1) = 0x118fdd;
  local_50 = skynet_context_new((char *)name,pcVar2);
  if (local_50 == (skynet_context *)0x0) {
    context_local = (skynet_context *)0x0;
  }
  else {
    pcVar2 = param_local + 0x30;
    id = local_50->handle;
    *(undefined8 *)((long)&uStack_70 + lVar1) = 0x11900d;
    id_to_hex(pcVar2,id);
    context_local = (skynet_context *)(param_local + 0x30);
  }
  return (char *)context_local;
}

Assistant:

static const char *
cmd_launch(struct skynet_context * context, const char * param) {
	size_t sz = strlen(param);
	char tmp[sz+1];
	strcpy(tmp,param);
	char * args = tmp;
	char * mod = strsep(&args, " \t\r\n");
	args = strsep(&args, "\r\n");
	struct skynet_context * inst = skynet_context_new(mod,args);
	if (inst == NULL) {
		return NULL;
	} else {
		id_to_hex(context->result, inst->handle);
		return context->result;
	}
}